

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O0

void shuff_generate_mapping
               (uint64_t *cw_lens,uint64_t *syms,uint64_t *freq,uint64_t max_cw_length,uint64_t n)

{
  uint64_t uVar1;
  int64_t i;
  uint64_t n_local;
  uint64_t max_cw_length_local;
  uint64_t *freq_local;
  uint64_t *syms_local;
  uint64_t *cw_lens_local;
  
  for (i = 1; i <= (int)max_cw_length; i = i + 1) {
    cw_lens[i] = cw_lens[i + -1] + cw_lens[i];
  }
  for (i = n - 1; -1 < i; i = i + -1) {
    uVar1 = cw_lens[freq[syms[i]] - 1];
    cw_lens[freq[syms[i]] - 1] = uVar1 + 1;
    syms[syms[i]] = uVar1;
  }
  return;
}

Assistant:

void shuff_generate_mapping(uint64_t* cw_lens, uint64_t* syms, uint64_t* freq,
    uint64_t max_cw_length, uint64_t n)
{
    int64_t i;

    for (i = 1; i <= (int)max_cw_length; i++)
        cw_lens[i] += cw_lens[i - 1];

    for (i = n - 1; i >= 0; i--) {
        syms[syms[i]] = cw_lens[freq[syms[i]] - 1]++;
    }
}